

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

bool __thiscall BufferedReader::incSeek(BufferedReader *this,int readerID,int64_t offset)

{
  char cVar1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar2 == 0) {
    p_Var5 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var5->_M_header;
    for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[(int)p_Var4[1]._M_color < readerID]
        ) {
      if (readerID <= (int)p_Var4[1]._M_color) {
        p_Var3 = p_Var4;
      }
    }
    p_Var4 = &p_Var5->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var5) &&
       (p_Var4 = p_Var3, readerID < (int)p_Var3[1]._M_color)) {
      p_Var4 = &p_Var5->_M_header;
    }
    if ((_Rb_tree_header *)p_Var4 == p_Var5) {
      cVar1 = '\0';
    }
    else {
      p_Var4 = p_Var4[1]._M_parent;
      cVar1 = (**(code **)(*(long *)p_Var4 + 0x10))(p_Var4,offset);
      if (cVar1 != '\0') {
        *(undefined1 *)((long)&p_Var4->_M_left + 3) = 0;
        *(undefined1 *)((long)&p_Var4->_M_parent + 1) = 0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return (bool)cVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool BufferedReader::incSeek(const int readerID, const int64_t offset)
{
    std::lock_guard lock(m_readersMtx);
    const auto itr = m_readers.find(readerID);
    if (itr != m_readers.end())
    {
        ReaderData* data = itr->second;
        const bool rez = data->incSeek(offset);
        if (rez)
        {
            data->m_eof = false;
            data->m_notified = false;
        }
        return rez;
    }
    return false;
}